

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O3

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDest(QPDFOutlineObjectHelper *this)

{
  undefined1 *puVar1;
  element_type *peVar2;
  QPDFObjectHandle *name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  undefined7 extraout_var;
  element_type *extraout_RAX;
  element_type *extraout_RAX_00;
  element_type *extraout_RAX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  long in_RSI;
  QPDFObject *__tmp;
  element_type *peVar8;
  QPDFObjectHandle QVar9;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Var10;
  QPDFObjectHandle local_148;
  undefined1 local_138 [32];
  QPDFObjectHandle local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  QPDFObjectHandle local_c8;
  element_type *local_b0;
  element_type *local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  long local_80 [2];
  QPDFObjectHandle local_70;
  QPDFObjectHandle local_60;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8._0_8_ = (element_type *)0x0;
  local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 8);
  local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  if ((element_type *)
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)
                        local_118.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(((element_type *)
                        local_118.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->value).
                       super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                       .
                       super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
               + 8);
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  peVar2 = (element_type *)(local_138 + 0x10);
  local_138._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/Dest","");
  bVar5 = QPDFObjectHandle::hasKey(&local_118,(string *)local_138);
  if ((element_type *)local_138._0_8_ != peVar2) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
  }
  if ((element_type *)
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (bVar5) {
    local_f8._16_8_ = *(undefined8 *)(in_RSI + 8);
    local_f8._24_8_ = *(long *)(in_RSI + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_)->_M_use_count + 1;
      }
    }
    local_138._0_8_ = peVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/Dest","");
    QPDFObjectHandle::getKey(&local_118,(string *)(local_f8 + 0x10));
    _Var3._M_pi = local_118.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    peVar8 = local_118.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _Var7._M_pi = local_148.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar8;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
       (element_type *)
       local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((element_type *)local_138._0_8_ != peVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._24_8_);
    }
  }
  else {
    local_a0._0_8_ = *(undefined8 *)(in_RSI + 8);
    local_a0._8_8_ = *(long *)(in_RSI + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_)->_M_use_count + 1;
      }
    }
    local_138._0_8_ = peVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/A","");
    QPDFObjectHandle::getKey(&local_c8,(string *)local_a0);
    _Var7._M_pi = local_c8.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_f8._0_8_ =
         local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    uVar4 = local_f8._8_8_;
    local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._8_8_ = _Var7._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
    }
    bVar5 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_f8);
    if (bVar5) {
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"/S","");
      QPDFObjectHandle::getKey(&local_60,(string *)local_f8);
      bVar5 = QPDFObjectHandle::isName(&local_60);
      if (bVar5) {
        local_90._M_allocated_capacity = (size_type)local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"/S","");
        QPDFObjectHandle::getKey(&local_70,(string *)local_f8);
        QPDFObjectHandle::getName_abi_cxx11_((string *)(local_f8 + 0x10),&local_70);
        iVar6 = std::__cxx11::string::compare(local_f8 + 0x10);
        if (iVar6 == 0) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/D","");
          bVar5 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_f8,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._16_8_ != &local_d8) {
          operator_delete((void *)local_f8._16_8_,local_d8._M_allocated_capacity + 1);
        }
        if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((long *)local_90._M_allocated_capacity != local_80) {
          operator_delete((void *)local_90._M_allocated_capacity,local_80[0] + 1);
        }
      }
      else {
        bVar5 = false;
      }
      if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)local_108) {
        operator_delete(local_118.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_108._0_8_ + 1);
      }
    }
    else {
      bVar5 = false;
    }
    if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((element_type *)local_138._0_8_ != peVar2) {
      operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
    }
    peVar8 = local_148.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar5 != false) {
      local_138._0_8_ = peVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"/D","");
      QPDFObjectHandle::getKey(&local_118,(string *)local_f8);
      _Var3._M_pi = local_118.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      peVar8 = local_118.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      _Var7._M_pi = local_148.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar8;
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      if (((element_type *)_Var7._M_pi != (element_type *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi),
         (element_type *)
         local_118.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi != (element_type *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((element_type *)local_138._0_8_ != peVar2) {
        operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
      }
    }
  }
  if (peVar8 == (element_type *)0x0) {
    QVar9 = QPDFObjectHandle::newNull();
    _Var7._M_pi = QVar9.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    goto LAB_001d1c76;
  }
  bVar5 = QPDFObjectHandle::isName(&local_148);
  if (bVar5) {
LAB_001d1bcd:
    name = (QPDFObjectHandle *)**(undefined8 **)(in_RSI + 0x28);
    local_b0 = local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_a8 = (element_type *)
               local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((element_type *)
        local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_148.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    _Var10 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)
             QPDFOutlineDocumentHelper::resolveNamedDest
                       ((QPDFOutlineDocumentHelper *)local_138,name);
    uVar4 = local_138._8_8_;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_138._0_8_;
    _Var7._M_pi = local_148.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_138._0_8_ = (element_type *)0x0;
    local_138._8_8_ = (element_type *)0x0;
    local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if ((element_type *)_Var7._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
      _Var10._M_refcount._M_pi = extraout_RDX_00._M_pi;
      _Var10._M_ptr = extraout_RAX;
      if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
        _Var10._M_refcount._M_pi = extraout_RDX_01._M_pi;
        _Var10._M_ptr = extraout_RAX_00;
      }
    }
    if (local_a8 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8);
      _Var10._M_refcount._M_pi = extraout_RDX_02._M_pi;
      _Var10._M_ptr = extraout_RAX_01;
    }
  }
  else {
    bVar5 = QPDFObjectHandle::isString(&local_148);
    _Var10._M_ptr._1_7_ = extraout_var;
    _Var10._M_ptr._0_1_ = bVar5;
    _Var10._M_refcount._M_pi = extraout_RDX._M_pi;
    if (bVar5) goto LAB_001d1bcd;
  }
  _Var3._M_pi = local_148.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var7 = _Var10._M_refcount._M_pi;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)
       local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
  local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
LAB_001d1c76:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    _Var7._M_pi = extraout_RDX_03;
  }
  if ((element_type *)
      local_148.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX_04;
  }
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var7._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDest()
{
    QPDFObjectHandle dest;
    QPDFObjectHandle A;
    if (oh().hasKey("/Dest")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper direct dest");
        dest = oh().getKey("/Dest");
    } else if (
        (A = oh().getKey("/A")).isDictionary() && A.getKey("/S").isName() &&
        (A.getKey("/S").getName() == "/GoTo") && A.hasKey("/D")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper action dest");
        dest = A.getKey("/D");
    }
    if (!dest) {
        return QPDFObjectHandle::newNull();
    }

    if (dest.isName() || dest.isString()) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper named dest");
        dest = m->dh.resolveNamedDest(dest);
    }

    return dest;
}